

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall DQuitMenu::HandleResult(DQuitMenu *this,bool res)

{
  int iVar1;
  undefined8 in_RAX;
  undefined7 in_register_00000031;
  undefined8 uStack_8;
  
  if ((int)CONCAT71(in_register_00000031,res) != 0) {
    uStack_8 = in_RAX;
    if ((!netgame) && (*(int *)(gameinfo.quitSound.Chars + -0xc) != 0)) {
      iVar1 = S_FindSound(gameinfo.quitSound.Chars);
      uStack_8 = CONCAT44(iVar1,(undefined4)uStack_8);
      S_Sound(0x22,(FSoundID *)((long)&uStack_8 + 4),snd_menuvolume.Value,0.0);
      I_WaitVBL(0x69);
    }
    ST_Endoom();
    return;
  }
  (*(this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject[0xd])();
  DMessageBoxMenu::CloseSound(&this->super_DMessageBoxMenu);
  return;
}

Assistant:

void DQuitMenu::HandleResult(bool res)
{
	if (res)
	{
		if (!netgame)
		{
			if (gameinfo.quitSound.IsNotEmpty())
			{
				S_Sound (CHAN_VOICE | CHAN_UI, gameinfo.quitSound, snd_menuvolume, ATTN_NONE);
				I_WaitVBL (105);
			}
		}
		ST_Endoom();
	}
	else
	{
		Close();
		CloseSound();
	}
}